

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O3

bool woff2::WriteFontCollection(FontCollection *font_collection,uint8_t *dst,size_t dst_size)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  bool bVar3;
  uint uVar4;
  size_t sVar6;
  ulong uVar7;
  pointer pFVar8;
  pointer pFVar9;
  long lVar10;
  size_t local_38;
  int iVar5;
  
  local_38 = 0;
  if (font_collection->flavor == 0x74746366) {
    dst[0] = 't';
    dst[1] = 't';
    dst[2] = 'c';
    dst[3] = 'f';
    uVar2 = font_collection->header_version;
    dst[4] = (uint8_t)(uVar2 >> 0x18);
    dst[5] = (uint8_t)(uVar2 >> 0x10);
    dst[6] = (uint8_t)(uVar2 >> 8);
    dst[7] = (uint8_t)uVar2;
    iVar5 = (int)((ulong)((long)(font_collection->fonts).
                                super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(font_collection->fonts).
                               super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 3);
    uVar4 = iVar5 * -0x49249249;
    *(uint *)(dst + 8) =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | iVar5 * -0x49000000;
    pFVar8 = (font_collection->fonts).super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pFVar9 = (font_collection->fonts).super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    sVar6 = 0xc;
    if (pFVar9 != pFVar8) {
      uVar7 = 0;
      do {
        puVar1 = dst + sVar6;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        sVar6 = sVar6 + 4;
        uVar7 = uVar7 + 1;
        pFVar8 = (font_collection->fonts).
                 super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pFVar9 = (font_collection->fonts).
                 super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      } while (uVar7 < (ulong)(((long)pFVar9 - (long)pFVar8 >> 3) * 0x6db6db6db6db6db7));
    }
    local_38 = sVar6;
    if (font_collection->header_version == 0x20000) {
      puVar1 = dst + sVar6;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      local_38 = sVar6 + 0xc;
      puVar1 = dst + sVar6 + 8;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pFVar8 = (font_collection->fonts).
               super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
               super__Vector_impl_data._M_start;
      pFVar9 = (font_collection->fonts).
               super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    if (pFVar9 == pFVar8) {
      bVar3 = true;
    }
    else {
      lVar10 = 0;
      uVar7 = 0;
      do {
        *(uint *)(dst + uVar7 * 4 + 0xc) =
             (uint)local_38 >> 0x18 | ((uint)local_38 & 0xff0000) >> 8 |
             ((uint)local_38 & 0xff00) << 8 | (uint)local_38 << 0x18;
        bVar3 = WriteFont((Font *)((long)&pFVar8->flavor + lVar10),&local_38,dst,dst_size);
        if (!bVar3) {
          return bVar3;
        }
        uVar7 = uVar7 + 1;
        pFVar8 = (font_collection->fonts).
                 super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 0x38;
      } while (uVar7 < (ulong)(((long)(font_collection->fonts).
                                      super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pFVar8 >> 3)
                              * 0x6db6db6db6db6db7));
    }
  }
  else {
    bVar3 = WriteFont((font_collection->fonts).
                      super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                      super__Vector_impl_data._M_start,&local_38,dst,dst_size);
  }
  return bVar3;
}

Assistant:

bool WriteFontCollection(const FontCollection& font_collection, uint8_t* dst,
                         size_t dst_size) {
  size_t offset = 0;

  // It's simpler if this just a simple sfnt
  if (font_collection.flavor != kTtcFontFlavor) {
    return WriteFont(font_collection.fonts[0], &offset, dst, dst_size);
  }

  // Write TTC header
  StoreU32(kTtcFontFlavor, &offset, dst);
  StoreU32(font_collection.header_version, &offset, dst);
  StoreU32(font_collection.fonts.size(), &offset, dst);

  // Offset Table, zeroed for now
  size_t offset_table = offset;  // where to write offsets later
  for (size_t i = 0; i < font_collection.fonts.size(); i++) {
    StoreU32(0, &offset, dst);
  }

  if (font_collection.header_version == 0x00020000) {
    StoreU32(0, &offset, dst);  // ulDsigTag
    StoreU32(0, &offset, dst);  // ulDsigLength
    StoreU32(0, &offset, dst);  // ulDsigOffset
  }

  // Write fonts and their offsets.
  for (size_t i = 0; i < font_collection.fonts.size(); i++) {
    const auto& font = font_collection.fonts[i];
    StoreU32(offset, &offset_table, dst);
    if (!WriteFont(font, &offset, dst, dst_size)) {
      return false;
    }
  }

  return true;
}